

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlSelect.cpp
# Opt level: O3

void __thiscall
Rml::ElementFormControlSelect::OnAttributeChange
          (ElementFormControlSelect *this,ElementAttributes *changed_attributes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  WidgetDropDown *this_00;
  code *pcVar2;
  bool bVar3;
  const_iterator cVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  String local_38;
  
  if (this->widget == (WidgetDropDown *)0x0) {
    bVar3 = Assert("RMLUI_ASSERT(widget)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Elements/ElementFormControlSelect.cpp"
                   ,0xb8);
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  ElementFormControl::OnAttributeChange(&this->super_ElementFormControl,changed_attributes);
  cVar4 = itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::find<char[6]>(changed_attributes,(char (*) [6])0x2d0239);
  if (cVar4._M_current !=
      (changed_attributes->m_container).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = this->widget;
    paVar1 = &local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)paVar1;
    Variant::
    GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&(cVar4._M_current)->second,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == paVar1) {
      local_38.field_2._8_8_ = local_58.field_2._8_8_;
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    }
    else {
      local_38._M_dataplus._M_p = local_58._M_dataplus._M_p;
    }
    local_38.field_2._M_allocated_capacity._1_7_ = local_58.field_2._M_allocated_capacity._1_7_;
    local_38.field_2._M_local_buf[0] = local_58.field_2._M_local_buf[0];
    local_38._M_string_length = local_58._M_string_length;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)paVar1;
    WidgetDropDown::OnValueChange(this_00,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void ElementFormControlSelect::OnAttributeChange(const ElementAttributes& changed_attributes)
{
	RMLUI_ASSERT(widget);

	ElementFormControl::OnAttributeChange(changed_attributes);

	auto it = changed_attributes.find("value");
	if (it != changed_attributes.end())
		widget->OnValueChange(it->second.Get<String>());
}